

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O0

void __thiscall wasm::Fuzzer::checkSubtypes(Fuzzer *this)

{
  value_type *pvVar1;
  bool bVar2;
  value_type *pvVar3;
  const_reference this_00;
  reference puVar4;
  const_reference pvVar5;
  ulong uVar6;
  Fatal *pFVar7;
  Fatal local_1d0;
  uintptr_t local_48;
  HeapType local_40;
  uint local_34;
  const_iterator cStack_30;
  uint sub;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  size_t super;
  Fuzzer *this_local;
  
  __range2 = (value_type *)0x0;
  super = (size_t)this;
  do {
    pvVar1 = __range2;
    pvVar3 = (value_type *)
             std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::size(&this->types);
    if (pvVar3 <= pvVar1) {
      return;
    }
    this_00 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[](&this->subtypeIndices,(size_type)__range2);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
    cStack_30 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffd0);
      if (!bVar2) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      local_34 = *puVar4;
      pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         (&this->types,(ulong)local_34);
      local_40.id = pvVar5->id;
      pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         (&this->types,(size_type)__range2);
      local_48 = pvVar5->id;
      uVar6 = wasm::HeapType::isSubType(local_40,(HeapType)local_48);
      if ((uVar6 & 1) == 0) {
        Fatal::Fatal(&local_1d0);
        pFVar7 = Fatal::operator<<(&local_1d0,(char (*) [10])0x265319);
        pFVar7 = Fatal::operator<<(pFVar7,&local_34);
        pFVar7 = Fatal::operator<<(pFVar7,(char (*) [34])" should be a subtype of HeapType ");
        pFVar7 = Fatal::operator<<(pFVar7,(unsigned_long *)&__range2);
        pFVar7 = Fatal::operator<<(pFVar7,(char (*) [14])" but is not!\n");
        pFVar7 = Fatal::operator<<(pFVar7,&local_34);
        pFVar7 = Fatal::operator<<(pFVar7,(char (*) [3])0x2652e0);
        pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           (&this->types,(ulong)local_34);
        pFVar7 = Fatal::operator<<(pFVar7,pvVar5);
        pFVar7 = Fatal::operator<<(pFVar7,(char (*) [2])0x2654d6);
        pFVar7 = Fatal::operator<<(pFVar7,(unsigned_long *)&__range2);
        pFVar7 = Fatal::operator<<(pFVar7,(char (*) [3])0x2652e0);
        pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           (&this->types,(size_type)__range2);
        pFVar7 = Fatal::operator<<(pFVar7,pvVar5);
        Fatal::operator<<(pFVar7,(char (*) [2])0x2654d6);
        Fatal::~Fatal(&local_1d0);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end2);
    }
    __range2 = (value_type *)
               ((long)&(__range2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1);
  } while( true );
}

Assistant:

void Fuzzer::checkSubtypes() const {
  for (size_t super = 0; super < types.size(); ++super) {
    for (auto sub : subtypeIndices[super]) {
      if (!HeapType::isSubType(types[sub], types[super])) {
        Fatal() << "HeapType " << sub << " should be a subtype of HeapType "
                << super << " but is not!\n"
                << sub << ": " << types[sub] << "\n"
                << super << ": " << types[super] << "\n";
      }
    }
  }
}